

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::UniformGridMediumProvider,pbrt::Bounds3<float>,pstd::optional<pbrt::SampledGrid<float>>,pstd::optional<pbrt::SampledGrid<pbrt::RGB>>,pbrt::RGBColorSpace_const*&,pbrt::SpectrumHandle&,pbrt::SampledGrid<float>,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,UniformGridMediumProvider *p,Bounds3<float> *args,
          optional<pbrt::SampledGrid<float>_> *args_1,
          optional<pbrt::SampledGrid<pbrt::RGB>_> *args_2,RGBColorSpace **args_3,
          SpectrumHandle *args_4,SampledGrid<float> *args_5,polymorphic_allocator<std::byte> *args_6
          )

{
  RGBColorSpace *colorSpace;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_c8;
  optional<pbrt::SampledGrid<pbrt::RGB>_> local_c0;
  optional<pbrt::SampledGrid<float>_> local_88;
  SampledGrid<float> local_50;
  
  optional<pbrt::SampledGrid<float>_>::optional(&local_88,args_1);
  optional<pbrt::SampledGrid<pbrt::RGB>_>::optional(&local_c0,args_2);
  colorSpace = *args_3;
  local_c8.bits =
       (args_4->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  pbrt::SampledGrid<float>::SampledGrid(&local_50,args_5);
  pbrt::UniformGridMediumProvider::UniformGridMediumProvider
            (p,args,&local_88,&local_c0,colorSpace,(SpectrumHandle *)&local_c8,&local_50,
             args_6->memoryResource);
  vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_50.values);
  optional<pbrt::SampledGrid<pbrt::RGB>_>::~optional(&local_c0);
  optional<pbrt::SampledGrid<float>_>::~optional(&local_88);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }